

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong b;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  ulong uVar10;
  long local_a8;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar1 = source->width;
  if (w < 0) {
    w = lVar1;
  }
  lVar2 = source->height;
  if (h < 0) {
    h = lVar2;
  }
  uVar5 = sx >> 0x3f & sx;
  lVar3 = x - uVar5;
  lVar9 = 0;
  if (sx < 1) {
    sx = lVar9;
  }
  uVar6 = sy >> 0x3f & sy;
  local_68 = y - uVar6;
  if (sy < 1) {
    sy = lVar9;
  }
  lVar8 = 0;
  if (0 < lVar3) {
    lVar8 = lVar3;
  }
  if (-1 < lVar3) {
    lVar3 = lVar9;
  }
  uVar5 = uVar5 + w + lVar3;
  lVar3 = sx - lVar3;
  local_70 = 0;
  if (0 < local_68) {
    local_70 = local_68;
  }
  if (-1 < local_68) {
    local_68 = lVar9;
  }
  uVar7 = uVar6 + h + local_68;
  local_68 = sy - local_68;
  uVar6 = lVar1 - lVar3;
  if ((long)(uVar5 + lVar3) <= lVar1) {
    uVar6 = uVar5;
  }
  uVar5 = lVar2 - local_68;
  if ((long)(uVar7 + local_68) <= lVar2) {
    uVar5 = uVar7;
  }
  uVar7 = this->width - lVar8;
  if ((long)(uVar6 + lVar8) <= this->width) {
    uVar7 = uVar6;
  }
  local_60 = this->height - local_70;
  if ((long)(uVar5 + local_70) <= this->height) {
    local_60 = uVar5;
  }
  if (0 < (long)local_60 && -1 < (long)(local_60 | uVar7)) {
    local_a8 = 0;
    local_58 = lVar3;
    do {
      if (0 < (long)uVar7) {
        lVar1 = local_a8 + local_68;
        lVar2 = local_a8 + local_70;
        lVar9 = 0;
        do {
          read_pixel(source,lVar3 + lVar9,lVar1,&local_78,&local_80,&local_88,&local_90);
          uVar5 = local_78;
          uVar6 = local_80;
          b = local_88;
          uVar10 = local_90;
          if (local_90 == this->max_value) {
LAB_0010b1e3:
            write_pixel(this,lVar8 + lVar9,lVar2,uVar5,uVar6,b,uVar10);
          }
          else if (local_90 != 0) {
            read_pixel(this,lVar8 + lVar9,lVar2,&local_38,&local_40,&local_48,&local_50);
            uVar10 = this->max_value;
            lVar4 = uVar10 - local_90;
            uVar5 = (local_38 * lVar4 + local_78 * local_90) / uVar10;
            lVar3 = local_58;
            uVar6 = (local_40 * lVar4 + local_80 * local_90) / uVar10;
            b = (local_48 * lVar4 + local_88 * local_90) / uVar10;
            uVar10 = (lVar4 * local_50 + local_90 * local_90) / uVar10;
            goto LAB_0010b1e3;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (long)uVar7);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 < (long)local_60);
  }
  return;
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      if (sa == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, sa);
      } else if (sa != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * sa + dr * (this->max_value - sa)) / this->max_value,
            (sg * sa + dg * (this->max_value - sa)) / this->max_value,
            (sb * sa + db * (this->max_value - sa)) / this->max_value,
            (sa * sa + da * (this->max_value - sa)) / this->max_value);
      }
    }
  }
}